

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_column_distribution(Integer s_a,Integer iproc,Integer *lo,Integer *hi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Integer jdim;
  Integer nproc;
  Integer hdl;
  Integer *hi_local;
  Integer *lo_local;
  Integer iproc_local;
  Integer s_a_local;
  
  lVar3 = s_a + 1000;
  lVar1 = SPA[lVar3].nprocs;
  lVar2 = SPA[lVar3].jdim;
  *lo = (SPA[lVar3].jdim * iproc) / lVar1;
  while ((*lo * lVar1) / lVar2 < iproc) {
    *lo = *lo + 1;
  }
  while (iproc < (*lo * lVar1) / lVar2) {
    *lo = *lo + -1;
  }
  if (iproc < lVar1 + -1) {
    *hi = (lVar2 * (iproc + 1)) / lVar1;
    while ((*hi * lVar1) / lVar2 < iproc + 1) {
      *hi = *hi + 1;
    }
    while (iproc + 1 < (*hi * lVar1) / lVar2) {
      *hi = *hi + -1;
    }
    *hi = *hi + -1;
  }
  else {
    *hi = lVar2 + -1;
  }
  return;
}

Assistant:

void pnga_sprs_array_column_distribution(Integer s_a, Integer iproc, Integer *lo,
    Integer *hi)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer nproc = SPA[hdl].nprocs;
  Integer jdim = SPA[hdl].jdim;
  *lo = (SPA[hdl].jdim*iproc)/nproc;
  while (((*lo)*nproc)/jdim < iproc) {
    (*lo)++;
  }
  while (((*lo)*nproc)/jdim > iproc) {
    (*lo)--;
  }
  if (iproc < nproc-1) {
    (*hi) = (jdim*(iproc+1))/nproc;
    while (((*hi)*nproc)/jdim < iproc+1) {
      (*hi)++;
    }
    while (((*hi)*nproc)/jdim > iproc+1) {
      (*hi)--;
    }
    (*hi)--;
  } else {
    *hi = jdim-1;
  }
}